

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

XMLError __thiscall tinyxml2::XMLElement::QueryInt64Text(XMLElement *this,int64_t *ival)

{
  XMLNode *pXVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar3;
  XMLError XVar4;
  longlong v;
  
  pXVar1 = (this->super_XMLNode)._firstChild;
  XVar4 = XML_NO_TEXT_NODE;
  if (pXVar1 != (XMLNode *)0x0) {
    iVar2 = (*pXVar1->_vptr_XMLNode[7])();
    if (CONCAT44(extraout_var,iVar2) != 0) {
      pXVar1 = (this->super_XMLNode)._firstChild;
      iVar2 = (*pXVar1->_vptr_XMLNode[9])(pXVar1);
      if (CONCAT44(extraout_var_00,iVar2) == 0) {
        pcVar3 = StrPair::GetStr(&pXVar1->_value);
      }
      else {
        pcVar3 = (char *)0x0;
      }
      iVar2 = __isoc99_sscanf(pcVar3,"%lld");
      XVar4 = XML_CAN_NOT_CONVERT_TEXT;
      if (iVar2 == 1) {
        *ival = 0;
        XVar4 = XML_SUCCESS;
      }
    }
  }
  return XVar4;
}

Assistant:

XMLError XMLElement::QueryInt64Text(int64_t* ival) const
{
	if (FirstChild() && FirstChild()->ToText()) {
		const char* t = FirstChild()->Value();
		if (XMLUtil::ToInt64(t, ival)) {
			return XML_SUCCESS;
		}
		return XML_CAN_NOT_CONVERT_TEXT;
	}
	return XML_NO_TEXT_NODE;
}